

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrSTA0x99(CPU *this)

{
  Memory *this_00;
  uint16_t addr;
  
  this_00 = this->m;
  addr = absolute_y_addr_j(this);
  Memory::Write8(this_00,addr,this->A);
  return 5;
}

Assistant:

int CPU::instrSTA0x99() {
	m->Write8(absolute_y_addr_j(), A);
	return 5;
}